

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O1

BaseState<true> * __thiscall
LabelSinglePropertyState<true>::Float
          (LabelSinglePropertyState<true> *this,Context<true> *ctx,float v)

{
  BaseState<true> *pBVar1;
  
  ctx->key = ctx->key + 7;
  ctx->key_length = ctx->key_length - 7;
  pBVar1 = LabelObjectState<true>::Float(&ctx->label_object_state,ctx,v);
  if (pBVar1 != (BaseState<true> *)0x0) {
    pBVar1 = ctx->previous_state;
  }
  return pBVar1;
}

Assistant:

BaseState<audit>* Float(Context<audit>& ctx, float v)
  {
    // skip "_label_"
    ctx.key += 7;
    ctx.key_length -= 7;

    if (ctx.label_object_state.Float(ctx, v) == nullptr)
      return nullptr;

    return ctx.previous_state;
  }